

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

void google::protobuf::internal::WireFormat::SerializeFieldWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  char cVar1;
  byte bVar2;
  undefined1 value;
  int iVar3;
  uint uVar4;
  uint32 value_00;
  float value_01;
  int32 value_02;
  uint value_03;
  undefined4 extraout_var;
  string *psVar6;
  double value_04;
  long lVar7;
  MessageLite *pMVar8;
  uint64 value_05;
  uint uVar9;
  anon_union_8_2_947300a4 anon_var_0;
  string scratch;
  long *plVar5;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  if ((((field[0x34] == (FieldDescriptor)0x1) &&
       (*(char *)(*(long *)(*(long *)(field + 0x38) + 0x20) + 0x58) == '\x01')) &&
      (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) == 10)) &&
     (*(int *)(field + 0x30) != 3)) {
    SerializeMessageSetItemWithCachedSizes(field,message,output);
    return;
  }
  if (*(int *)(field + 0x30) == 3) {
    uVar4 = (**(code **)(*plVar5 + 0x30))();
  }
  else {
    bVar2 = (**(code **)(*plVar5 + 0x28))(plVar5,message,field);
    uVar4 = (uint)bVar2;
  }
  cVar1 = *(char *)(*(long *)(field + 0x60) + 0x44);
  if (0 < (int)uVar4 && cVar1 == '\x01') {
    io::CodedOutputStream::WriteVarint32(output,*(int *)(field + 0x28) * 8 + 2);
    value_00 = FieldDataOnlyByteSize(field,message);
    io::CodedOutputStream::WriteVarint32(output,value_00);
  }
  uVar9 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = uVar9;
  }
  do {
    if (uVar4 == uVar9) {
      return;
    }
    switch(*(undefined4 *)(field + 0x2c)) {
    case 1:
      if (*(int *)(field + 0x30) == 3) {
        value_04 = (double)(**(code **)(*plVar5 + 0x140))();
      }
      else {
        value_04 = (double)(**(code **)(*plVar5 + 0x90))(plVar5,message,field);
      }
      if (cVar1 == '\0') {
        WireFormatLite::WriteDouble(*(int *)(field + 0x28),value_04,output);
      }
      else {
LAB_001ca3cc:
        io::CodedOutputStream::WriteLittleEndian64(output,(uint64)value_04);
      }
      break;
    case 2:
      if (*(int *)(field + 0x30) == 3) {
        value_01 = (float)(**(code **)(*plVar5 + 0x138))();
      }
      else {
        value_01 = (float)(**(code **)(*plVar5 + 0x88))(plVar5,message,field);
      }
      if (cVar1 == '\0') {
        WireFormatLite::WriteFloat(*(int *)(field + 0x28),value_01,output);
      }
      else {
LAB_001ca432:
        io::CodedOutputStream::WriteLittleEndian32(output,(uint32)value_01);
      }
      break;
    case 3:
      if (*(int *)(field + 0x30) == 3) {
        value_05 = (**(code **)(*plVar5 + 0x120))();
      }
      else {
        value_05 = (**(code **)(*plVar5 + 0x70))(plVar5,message,field);
      }
      if (cVar1 == '\0') {
        WireFormatLite::WriteInt64(*(int *)(field + 0x28),value_05,output);
      }
      else {
LAB_001ca38f:
        io::CodedOutputStream::WriteVarint64(output,value_05);
      }
      break;
    case 4:
      if (*(int *)(field + 0x30) == 3) {
        value_05 = (**(code **)(*plVar5 + 0x130))();
      }
      else {
        value_05 = (**(code **)(*plVar5 + 0x80))(plVar5,message,field);
      }
      if (cVar1 != '\0') goto LAB_001ca38f;
      WireFormatLite::WriteUInt64(*(int *)(field + 0x28),value_05,output);
      break;
    case 5:
      if (*(int *)(field + 0x30) == 3) {
        value_02 = (**(code **)(*plVar5 + 0x118))();
      }
      else {
        value_02 = (**(code **)(*plVar5 + 0x68))(plVar5,message,field);
      }
      if (cVar1 == '\0') {
        WireFormatLite::WriteInt32(*(int *)(field + 0x28),value_02,output);
      }
      else {
LAB_001ca401:
        io::CodedOutputStream::WriteVarint32SignExtended(output,value_02);
      }
      break;
    case 6:
      if (*(int *)(field + 0x30) == 3) {
        value_04 = (double)(**(code **)(*plVar5 + 0x130))();
      }
      else {
        value_04 = (double)(**(code **)(*plVar5 + 0x80))(plVar5,message,field);
      }
      if (cVar1 != '\0') goto LAB_001ca3cc;
      WireFormatLite::WriteFixed64(*(int *)(field + 0x28),(uint64)value_04,output);
      break;
    case 7:
      if (*(int *)(field + 0x30) == 3) {
        value_01 = (float)(**(code **)(*plVar5 + 0x128))();
      }
      else {
        value_01 = (float)(**(code **)(*plVar5 + 0x78))(plVar5,message,field);
      }
      if (cVar1 != '\0') goto LAB_001ca432;
      WireFormatLite::WriteFixed32(*(int *)(field + 0x28),(uint32)value_01,output);
      break;
    case 8:
      if (*(int *)(field + 0x30) == 3) {
        value = (**(code **)(*plVar5 + 0x148))();
      }
      else {
        value = (**(code **)(*plVar5 + 0x98))(plVar5,message,field);
      }
      value_03 = (uint)(byte)value;
      if (cVar1 == '\0') {
        WireFormatLite::WriteBool(*(int *)(field + 0x28),(bool)value,output);
      }
      else {
LAB_001ca300:
        io::CodedOutputStream::WriteVarint32(output,value_03);
      }
      break;
    case 9:
      scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
      scratch._M_string_length = 0;
      scratch.field_2._M_local_buf[0] = '\0';
      if (*(int *)(field + 0x30) == 3) {
        psVar6 = (string *)(**(code **)(*plVar5 + 0x168))(plVar5,message,field,uVar9,&scratch);
      }
      else {
        psVar6 = (string *)(**(code **)(*plVar5 + 0xb8))(plVar5,message,field,&scratch);
      }
      VerifyUTF8StringFallback((psVar6->_M_dataplus)._M_p,(int)psVar6->_M_string_length,SERIALIZE);
      WireFormatLite::WriteString(*(int *)(field + 0x28),psVar6,output);
      goto LAB_001ca49a;
    case 10:
      iVar3 = *(int *)(field + 0x28);
      if (*(int *)(field + 0x30) == 3) {
        pMVar8 = (MessageLite *)(**(code **)(*plVar5 + 0x160))();
      }
      else {
        pMVar8 = (MessageLite *)(**(code **)(*plVar5 + 0xb0))(plVar5,message,field,0);
      }
      WireFormatLite::WriteGroup(iVar3,pMVar8,output);
      break;
    case 0xb:
      iVar3 = *(int *)(field + 0x28);
      if (*(int *)(field + 0x30) == 3) {
        pMVar8 = (MessageLite *)(**(code **)(*plVar5 + 0x160))();
      }
      else {
        pMVar8 = (MessageLite *)(**(code **)(*plVar5 + 0xb0))(plVar5,message,field,0);
      }
      WireFormatLite::WriteMessage(iVar3,pMVar8,output);
      break;
    case 0xc:
      scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
      scratch._M_string_length = 0;
      scratch.field_2._M_local_buf[0] = '\0';
      if (*(int *)(field + 0x30) == 3) {
        psVar6 = (string *)(**(code **)(*plVar5 + 0x168))(plVar5,message,field,uVar9,&scratch);
      }
      else {
        psVar6 = (string *)(**(code **)(*plVar5 + 0xb8))(plVar5,message,field,&scratch);
      }
      WireFormatLite::WriteBytes(*(int *)(field + 0x28),psVar6,output);
LAB_001ca49a:
      std::__cxx11::string::~string((string *)&scratch);
      break;
    case 0xd:
      if (*(int *)(field + 0x30) == 3) {
        value_03 = (**(code **)(*plVar5 + 0x128))();
      }
      else {
        value_03 = (**(code **)(*plVar5 + 0x78))(plVar5,message,field);
      }
      if (cVar1 != '\0') goto LAB_001ca300;
      WireFormatLite::WriteUInt32(*(int *)(field + 0x28),value_03,output);
      break;
    case 0xe:
      if (*(int *)(field + 0x30) == 3) {
        lVar7 = (**(code **)(*plVar5 + 0x158))();
      }
      else {
        lVar7 = (**(code **)(*plVar5 + 0xa8))(plVar5,message,field);
      }
      if (cVar1 != '\0') {
        value_02 = *(int32 *)(lVar7 + 0x10);
        goto LAB_001ca401;
      }
      WireFormatLite::WriteEnum(*(int *)(field + 0x28),*(int *)(lVar7 + 0x10),output);
      break;
    case 0xf:
      if (*(int *)(field + 0x30) == 3) {
        value_01 = (float)(**(code **)(*plVar5 + 0x118))();
      }
      else {
        value_01 = (float)(**(code **)(*plVar5 + 0x68))(plVar5,message,field);
      }
      if (cVar1 != '\0') goto LAB_001ca432;
      WireFormatLite::WriteSFixed32(*(int *)(field + 0x28),(int32)value_01,output);
      break;
    case 0x10:
      if (*(int *)(field + 0x30) == 3) {
        value_04 = (double)(**(code **)(*plVar5 + 0x120))();
      }
      else {
        value_04 = (double)(**(code **)(*plVar5 + 0x70))(plVar5,message,field);
      }
      if (cVar1 != '\0') goto LAB_001ca3cc;
      WireFormatLite::WriteSFixed64(*(int *)(field + 0x28),(int64)value_04,output);
      break;
    case 0x11:
      if (*(int *)(field + 0x30) == 3) {
        iVar3 = (**(code **)(*plVar5 + 0x118))();
      }
      else {
        iVar3 = (**(code **)(*plVar5 + 0x68))(plVar5,message,field);
      }
      if (cVar1 != '\0') {
        value_03 = iVar3 >> 0x1f ^ iVar3 * 2;
        goto LAB_001ca300;
      }
      WireFormatLite::WriteSInt32(*(int *)(field + 0x28),iVar3,output);
      break;
    case 0x12:
      if (*(int *)(field + 0x30) == 3) {
        lVar7 = (**(code **)(*plVar5 + 0x120))();
      }
      else {
        lVar7 = (**(code **)(*plVar5 + 0x70))(plVar5,message,field);
      }
      if (cVar1 != '\0') {
        value_05 = lVar7 >> 0x3f ^ lVar7 * 2;
        goto LAB_001ca38f;
      }
      WireFormatLite::WriteSInt64(*(int *)(field + 0x28),lVar7,output);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void WireFormat::SerializeFieldWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    SerializeMessageSetItemWithCachedSizes(field, message, output);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const bool is_packed = field->options().packed();
  if (is_packed && count > 0) {
    WireFormatLite::WriteTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    const int data_size = FieldDataOnlyByteSize(field, message);
    output->WriteVarint32(data_size);
  }

  for (int j = 0; j < count; j++) {
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        const CPPTYPE value = field->is_repeated() ?                           \
                              message_reflection->GetRepeated##CPPTYPE_METHOD( \
                                message, field, j) :                           \
                              message_reflection->Get##CPPTYPE_METHOD(         \
                                message, field);                               \
        if (is_packed) {                                                       \
          WireFormatLite::Write##TYPE_METHOD##NoTag(value, output);            \
        } else {                                                               \
          WireFormatLite::Write##TYPE_METHOD(field->number(), value, output);  \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PRIMITIVE_TYPE( INT32,  int32,  Int32,  Int32)
      HANDLE_PRIMITIVE_TYPE( INT64,  int64,  Int64,  Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32,  int32, SInt32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64,  int64, SInt64,  Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE( FIXED32, uint32,  Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE( FIXED64, uint64,  Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32,  int32, SFixed32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64,  int64, SFixed64,  Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT , float , Float , Float )
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                       \
      case FieldDescriptor::TYPE_##TYPE:                                     \
        WireFormatLite::Write##TYPE_METHOD(                                  \
              field->number(),                                               \
              field->is_repeated() ?                                         \
                message_reflection->GetRepeated##CPPTYPE_METHOD(             \
                  message, field, j) :                                       \
                message_reflection->Get##CPPTYPE_METHOD(message, field),     \
              output);                                                       \
        break;

      HANDLE_TYPE(GROUP  , Group  , Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value = field->is_repeated() ?
          message_reflection->GetRepeatedEnum(message, field, j) :
          message_reflection->GetEnum(message, field);
        if (is_packed) {
          WireFormatLite::WriteEnumNoTag(value->number(), output);
        } else {
          WireFormatLite::WriteEnum(field->number(), value->number(), output);
        }
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        VerifyUTF8String(value.data(), value.length(), SERIALIZE);
        WireFormatLite::WriteString(field->number(), value, output);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        WireFormatLite::WriteBytes(field->number(), value, output);
        break;
      }
    }
  }
}